

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

_Bool av1_add_to_hash_map_by_row_with_precal_data
                (hash_table *p_hash_table,uint32_t **pic_hash,int8_t *pic_is_same,int pic_width,
                int pic_height,int block_size)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t hash_value;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  uint32_t hash_value1;
  block_hash curr_block_hash;
  int pos;
  int y_pos;
  int x_pos;
  int crc_mask;
  int add_value;
  uint32_t *src_hash [2];
  int8_t *src_is_added;
  int y_end;
  int x_end;
  int iVar4;
  int iVar5;
  
  lVar1 = *in_RSI;
  iVar3 = hash_block_size_to_index(in_R9D);
  iVar5 = 0;
  do {
    if ((in_ECX - in_R9D) + 1 <= iVar5) {
      return true;
    }
    for (iVar4 = 0; iVar4 < (in_R8D - in_R9D) + 1; iVar4 = iVar4 + 1) {
      hash_value = iVar4 * in_ECX + iVar5;
      if ((*(char *)(in_RDX + (int)hash_value) != '\0') &&
         (_Var2 = hash_table_add_to_table
                            ((hash_table *)CONCAT44(iVar5,iVar4),hash_value,
                             (block_hash *)
                             CONCAT26((short)iVar4,
                                      CONCAT24((short)iVar5,
                                               (*(uint *)(lVar1 + (long)(int)hash_value * 4) &
                                               0xffff) + iVar3 * 0x10000))), !_Var2)) {
        return false;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool av1_add_to_hash_map_by_row_with_precal_data(hash_table *p_hash_table,
                                                 uint32_t *pic_hash[2],
                                                 int8_t *pic_is_same,
                                                 int pic_width, int pic_height,
                                                 int block_size) {
  const int x_end = pic_width - block_size + 1;
  const int y_end = pic_height - block_size + 1;

  const int8_t *src_is_added = pic_is_same;
  const uint32_t *src_hash[2] = { pic_hash[0], pic_hash[1] };

  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  for (int x_pos = 0; x_pos < x_end; x_pos++) {
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      const int pos = y_pos * pic_width + x_pos;
      // valid data
      if (src_is_added[pos]) {
        block_hash curr_block_hash;
        curr_block_hash.x = x_pos;
        curr_block_hash.y = y_pos;

        const uint32_t hash_value1 = (src_hash[0][pos] & crc_mask) + add_value;
        curr_block_hash.hash_value2 = src_hash[1][pos];

        if (!hash_table_add_to_table(p_hash_table, hash_value1,
                                     &curr_block_hash)) {
          return false;
        }
      }
    }
  }
  return true;
}